

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_log_postf(ma_log *pLog,ma_uint32 level,char *pFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  ma_result result;
  __va_list_tag *in_stack_00000320;
  char *in_stack_00000328;
  ma_uint32 in_stack_00000334;
  ma_log *in_stack_00000338;
  undefined1 auStack_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_20;
  undefined4 local_14;
  long local_10;
  ma_result local_4;
  
  local_38 = auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((in_RDI == 0) || (in_RDX == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_40 = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x18;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_4 = ma_log_postv(in_stack_00000338,in_stack_00000334,in_stack_00000328,in_stack_00000320);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_log_postf(ma_log* pLog, ma_uint32 level, const char* pFormat, ...)
{
    ma_result result;
    va_list args;

    if (pLog == NULL || pFormat == NULL) {
        return MA_INVALID_ARGS;
    }

    va_start(args, pFormat);
    {
        result = ma_log_postv(pLog, level, pFormat, args);
    }
    va_end(args);

    return result;
}